

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::SetProperty(cmTarget *this,string *prop,char *value)

{
  TargetType tgtType;
  cmMakefile *pcVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  cmMessenger *messenger;
  ostream *poVar5;
  cmGlobalGenerator *this_00;
  char *__s;
  char *value_local;
  string local_1c0;
  ostringstream e;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198 [46];
  
  tgtType = this->TargetTypeValue;
  value_local = value;
  messenger = cmMakefile::GetMessenger(this->Makefile);
  cmMakefile::GetBacktrace((cmMakefile *)&e);
  bVar2 = cmTargetPropertyComputer::PassesWhitelist
                    (tgtType,prop,messenger,(cmListFileBacktrace *)&e);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_198);
  if (!bVar2) {
    return;
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_DEFINITIONS_abi_cxx11_ ==
       '\0') &&
     (iVar4 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propCOMPILE_DEFINITIONS_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propCOMPILE_DEFINITIONS_abi_cxx11_,"COMPILE_DEFINITIONS",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCOMPILE_DEFINITIONS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propCOMPILE_DEFINITIONS_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_FEATURES_abi_cxx11_ == '\0'
      ) && (iVar4 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                         propCOMPILE_FEATURES_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propCOMPILE_FEATURES_abi_cxx11_,"COMPILE_FEATURES",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCOMPILE_FEATURES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propCOMPILE_FEATURES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_OPTIONS_abi_cxx11_ == '\0')
     && (iVar4 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                      propCOMPILE_OPTIONS_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_OPTIONS_abi_cxx11_
               ,"COMPILE_OPTIONS",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCOMPILE_OPTIONS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propCOMPILE_OPTIONS_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCUDA_PTX_COMPILATION_abi_cxx11_ ==
       '\0') &&
     (iVar4 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propCUDA_PTX_COMPILATION_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propCUDA_PTX_COMPILATION_abi_cxx11_,"CUDA_PTX_COMPILATION",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCUDA_PTX_COMPILATION_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propCUDA_PTX_COMPILATION_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propEXPORT_NAME_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_,
               "EXPORT_NAME",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propEXPORT_NAME_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propIMPORTED_GLOBAL_abi_cxx11_ == '\0')
     && (iVar4 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                      propIMPORTED_GLOBAL_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propIMPORTED_GLOBAL_abi_cxx11_
               ,"IMPORTED_GLOBAL",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propIMPORTED_GLOBAL_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propIMPORTED_GLOBAL_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propINCLUDE_DIRECTORIES_abi_cxx11_ ==
       '\0') &&
     (iVar4 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propINCLUDE_DIRECTORIES_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propINCLUDE_DIRECTORIES_abi_cxx11_,"INCLUDE_DIRECTORIES",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propINCLUDE_DIRECTORIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propINCLUDE_DIRECTORIES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_OPTIONS_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propLINK_OPTIONS_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_OPTIONS_abi_cxx11_,
               "LINK_OPTIONS",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_OPTIONS_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propLINK_OPTIONS_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_DIRECTORIES_abi_cxx11_ == '\0'
      ) && (iVar4 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                         propLINK_DIRECTORIES_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propLINK_DIRECTORIES_abi_cxx11_,"LINK_DIRECTORIES",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propLINK_DIRECTORIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propLINK_DIRECTORIES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_LIBRARIES_abi_cxx11_ == '\0')
     && (iVar4 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                      propLINK_LIBRARIES_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_LIBRARIES_abi_cxx11_,
               "LINK_LIBRARIES",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propLINK_LIBRARIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propLINK_LIBRARIES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::
       propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,"MANUALLY_ADDED_DEPENDENCIES",
               (allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propNAME_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_,
               "NAME",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propSOURCES_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_,
               "SOURCES",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propSOURCES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propTYPE_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_,
               "TYPE",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_);
  }
  _Var3 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
  if (_Var3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    std::operator<<((ostream *)&e,"MANUALLY_ADDED_DEPENDENCIES property is read-only\n");
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c0);
  }
  else {
    _Var3 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                  propNAME_abi_cxx11_);
    if (_Var3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"NAME property is read-only\n");
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c0);
    }
    else {
      _Var3 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                    propTYPE_abi_cxx11_);
      if (_Var3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::operator<<((ostream *)&e,"TYPE property is read-only\n");
        pcVar1 = this->Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c0);
      }
      else {
        _Var3 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                      propEXPORT_NAME_abi_cxx11_);
        if ((_Var3) && (this->IsImportedTarget == true)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar5 = std::operator<<((ostream *)&e,
                                   "EXPORT_NAME property can\'t be set on imported targets (\"");
          poVar5 = std::operator<<(poVar5,(string *)&this->Name);
          std::operator<<(poVar5,"\")\n");
          pcVar1 = this->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c0);
        }
        else {
          _Var3 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                        propSOURCES_abi_cxx11_);
          if ((_Var3) && (this->IsImportedTarget == true)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar5 = std::operator<<((ostream *)&e,
                                     "SOURCES property can\'t be set on imported targets (\"");
            poVar5 = std::operator<<(poVar5,(string *)&this->Name);
            std::operator<<(poVar5,"\")\n");
            pcVar1 = this->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c0);
          }
          else {
            _Var3 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                          propIMPORTED_GLOBAL_abi_cxx11_);
            if ((!_Var3) || (this->IsImportedTarget != false)) {
              _Var3 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                            propINCLUDE_DIRECTORIES_abi_cxx11_);
              if (_Var3) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::clear(&((this->Internal).Pointer)->IncludeDirectoriesEntries);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                          (&((this->Internal).Pointer)->IncludeDirectoriesBacktraces);
                if (value_local == (char *)0x0) {
                  return;
                }
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<char_const*&>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           (this->Internal).Pointer,&value_local);
                cmMakefile::GetBacktrace((cmMakefile *)&e);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                          (&((this->Internal).Pointer)->IncludeDirectoriesBacktraces,
                           (value_type *)&e);
              }
              else {
                _Var3 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                              propCOMPILE_OPTIONS_abi_cxx11_);
                if (_Var3) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::clear(&((this->Internal).Pointer)->CompileOptionsEntries);
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                            (&((this->Internal).Pointer)->CompileOptionsBacktraces);
                  if (value_local == (char *)0x0) {
                    return;
                  }
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const*&>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &((this->Internal).Pointer)->CompileOptionsEntries,&value_local);
                  cmMakefile::GetBacktrace((cmMakefile *)&e);
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                            (&((this->Internal).Pointer)->CompileOptionsBacktraces,(value_type *)&e)
                  ;
                }
                else {
                  _Var3 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)
                                                ::propCOMPILE_FEATURES_abi_cxx11_);
                  if (_Var3) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::clear(&((this->Internal).Pointer)->CompileFeaturesEntries);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                              (&((this->Internal).Pointer)->CompileFeaturesBacktraces);
                    if (value_local == (char *)0x0) {
                      return;
                    }
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const*&>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &((this->Internal).Pointer)->CompileFeaturesEntries,&value_local);
                    cmMakefile::GetBacktrace((cmMakefile *)&e);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                    push_back(&((this->Internal).Pointer)->CompileFeaturesBacktraces,
                              (value_type *)&e);
                  }
                  else {
                    _Var3 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propCOMPILE_DEFINITIONS_abi_cxx11_);
                    if (_Var3) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::clear(&((this->Internal).Pointer)->CompileDefinitionsEntries);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                                (&((this->Internal).Pointer)->CompileDefinitionsBacktraces);
                      if (value_local == (char *)0x0) {
                        return;
                      }
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<char_const*&>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&((this->Internal).Pointer)->CompileDefinitionsEntries,
                                 &value_local);
                      cmMakefile::GetBacktrace((cmMakefile *)&e);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                      push_back(&((this->Internal).Pointer)->CompileDefinitionsBacktraces,
                                (value_type *)&e);
                    }
                    else {
                      _Var3 = std::operator==(prop,&
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propLINK_OPTIONS_abi_cxx11_);
                      if (_Var3) {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::clear(&((this->Internal).Pointer)->LinkOptionsEntries);
                        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                        clear(&((this->Internal).Pointer)->LinkOptionsBacktraces);
                        if (value_local == (char *)0x0) {
                          return;
                        }
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<char_const*&>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&((this->Internal).Pointer)->LinkOptionsEntries,&value_local);
                        cmMakefile::GetBacktrace((cmMakefile *)&e);
                        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                        push_back(&((this->Internal).Pointer)->LinkOptionsBacktraces,
                                  (value_type *)&e);
                      }
                      else {
                        _Var3 = std::operator==(prop,&
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propLINK_DIRECTORIES_abi_cxx11_);
                        if (_Var3) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::clear(&((this->Internal).Pointer)->LinkDirectoriesEntries);
                          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                          clear(&((this->Internal).Pointer)->LinkDirectoriesBacktraces);
                          if (value_local == (char *)0x0) {
                            return;
                          }
                          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<char_const*&>
                                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)&((this->Internal).Pointer)->LinkDirectoriesEntries,
                                     &value_local);
                          cmMakefile::GetBacktrace((cmMakefile *)&e);
                          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                          push_back(&((this->Internal).Pointer)->LinkDirectoriesBacktraces,
                                    (value_type *)&e);
                        }
                        else {
                          _Var3 = std::operator==(prop,&
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propLINK_LIBRARIES_abi_cxx11_);
                          if (_Var3) {
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::clear(&((this->Internal).Pointer)->LinkImplementationPropertyEntries);
                            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                            clear(&((this->Internal).Pointer)->LinkImplementationPropertyBacktraces)
                            ;
                            if (value_local == (char *)0x0) {
                              return;
                            }
                            cmMakefile::GetBacktrace((cmMakefile *)&e);
                            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                            emplace_back<char_const*&>
                                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                        *)&((this->Internal).Pointer)->
                                           LinkImplementationPropertyEntries,&value_local);
                            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                            push_back(&((this->Internal).Pointer)->
                                       LinkImplementationPropertyBacktraces,(value_type *)&e);
                          }
                          else {
                            _Var3 = std::operator==(prop,&
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propSOURCES_abi_cxx11_);
                            if (!_Var3) {
                              _Var3 = std::operator==(prop,&
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propIMPORTED_GLOBAL_abi_cxx11_);
                              if (_Var3) {
                                bVar2 = cmSystemTools::IsOn(value_local);
                                if (bVar2) {
                                  if (this->ImportedGloballyVisible != false) {
                                    return;
                                  }
                                  this->ImportedGloballyVisible = true;
                                  this_00 = GetGlobalGenerator(this);
                                  cmGlobalGenerator::IndexTarget(this_00,this);
                                  return;
                                }
                                std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                                poVar5 = std::operator<<((ostream *)&e,
                                                                                                                  
                                                  "IMPORTED_GLOBAL property can\'t be set to FALSE on targets (\""
                                                  );
                                poVar5 = std::operator<<(poVar5,(string *)&this->Name);
                                std::operator<<(poVar5,"\")\n");
                                pcVar1 = this->Makefile;
                                std::__cxx11::stringbuf::str();
                                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c0);
                              }
                              else {
                                bVar2 = cmHasLiteralPrefix<std::__cxx11::string,17ul>
                                                  (prop,(char (*) [17])"IMPORTED_LIBNAME");
                                if (bVar2) {
                                  __s = "";
                                  if (value_local != (char *)0x0) {
                                    __s = value_local;
                                  }
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&e,__s,(allocator<char> *)&local_1c0);
                                  bVar2 = CheckImportedLibName(this,prop,(string *)&e);
                                  std::__cxx11::string::~string((string *)&e);
                                  if (!bVar2) {
                                    return;
                                  }
                                }
                                _Var3 = std::operator==(prop,&
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propCUDA_PTX_COMPILATION_abi_cxx11_);
                                if ((!_Var3) || (this->TargetTypeValue == OBJECT_LIBRARY)) {
                                  cmPropertyMap::SetProperty(&this->Properties,prop,value_local);
                                  return;
                                }
                                std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                                poVar5 = std::operator<<((ostream *)&e,
                                                                                                                  
                                                  "CUDA_PTX_COMPILATION property can only be applied to OBJECT targets (\""
                                                  );
                                poVar5 = std::operator<<(poVar5,(string *)&this->Name);
                                std::operator<<(poVar5,"\")\n");
                                pcVar1 = this->Makefile;
                                std::__cxx11::stringbuf::str();
                                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c0);
                              }
                              goto LAB_002ace05;
                            }
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::clear(&((this->Internal).Pointer)->SourceEntries);
                            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                            clear(&((this->Internal).Pointer)->SourceBacktraces);
                            if (value_local == (char *)0x0) {
                              return;
                            }
                            cmMakefile::GetBacktrace((cmMakefile *)&e);
                            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                            emplace_back<char_const*&>
                                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                        *)&((this->Internal).Pointer)->SourceEntries,&value_local);
                            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                            push_back(&((this->Internal).Pointer)->SourceBacktraces,(value_type *)&e
                                     );
                          }
                        }
                      }
                    }
                  }
                }
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_198);
              return;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar5 = std::operator<<((ostream *)&e,
                                     "IMPORTED_GLOBAL property can\'t be set on non-imported targets (\""
                                    );
            poVar5 = std::operator<<(poVar5,(string *)&this->Name);
            std::operator<<(poVar5,"\")\n");
            pcVar1 = this->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c0);
          }
        }
      }
    }
  }
LAB_002ace05:
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return;
}

Assistant:

void cmTarget::SetProperty(const std::string& prop, const char* value)
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, this->Makefile->GetMessenger(),
        this->Makefile->GetBacktrace())) {
    return;
  }
#define MAKE_STATIC_PROP(PROP) static const std::string prop##PROP = #PROP
  MAKE_STATIC_PROP(COMPILE_DEFINITIONS);
  MAKE_STATIC_PROP(COMPILE_FEATURES);
  MAKE_STATIC_PROP(COMPILE_OPTIONS);
  MAKE_STATIC_PROP(CUDA_PTX_COMPILATION);
  MAKE_STATIC_PROP(EXPORT_NAME);
  MAKE_STATIC_PROP(IMPORTED_GLOBAL);
  MAKE_STATIC_PROP(INCLUDE_DIRECTORIES);
  MAKE_STATIC_PROP(LINK_OPTIONS);
  MAKE_STATIC_PROP(LINK_DIRECTORIES);
  MAKE_STATIC_PROP(LINK_LIBRARIES);
  MAKE_STATIC_PROP(MANUALLY_ADDED_DEPENDENCIES);
  MAKE_STATIC_PROP(NAME);
  MAKE_STATIC_PROP(SOURCES);
  MAKE_STATIC_PROP(TYPE);
#undef MAKE_STATIC_PROP
  if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
    std::ostringstream e;
    e << "MANUALLY_ADDED_DEPENDENCIES property is read-only\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propNAME) {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propTYPE) {
    std::ostringstream e;
    e << "TYPE property is read-only\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propEXPORT_NAME && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propSOURCES && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\"" << this->Name
      << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propIMPORTED_GLOBAL && !this->IsImported()) {
    std::ostringstream e;
    e << "IMPORTED_GLOBAL property can't be set on non-imported targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (prop == propINCLUDE_DIRECTORIES) {
    this->Internal->IncludeDirectoriesEntries.clear();
    this->Internal->IncludeDirectoriesBacktraces.clear();
    if (value) {
      this->Internal->IncludeDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->IncludeDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == propCOMPILE_OPTIONS) {
    this->Internal->CompileOptionsEntries.clear();
    this->Internal->CompileOptionsBacktraces.clear();
    if (value) {
      this->Internal->CompileOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == propCOMPILE_FEATURES) {
    this->Internal->CompileFeaturesEntries.clear();
    this->Internal->CompileFeaturesBacktraces.clear();
    if (value) {
      this->Internal->CompileFeaturesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileFeaturesBacktraces.push_back(lfbt);
    }
  } else if (prop == propCOMPILE_DEFINITIONS) {
    this->Internal->CompileDefinitionsEntries.clear();
    this->Internal->CompileDefinitionsBacktraces.clear();
    if (value) {
      this->Internal->CompileDefinitionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileDefinitionsBacktraces.push_back(lfbt);
    }
  } else if (prop == propLINK_OPTIONS) {
    this->Internal->LinkOptionsEntries.clear();
    this->Internal->LinkOptionsBacktraces.clear();
    if (value) {
      this->Internal->LinkOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == propLINK_DIRECTORIES) {
    this->Internal->LinkDirectoriesEntries.clear();
    this->Internal->LinkDirectoriesBacktraces.clear();
    if (value) {
      this->Internal->LinkDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == propLINK_LIBRARIES) {
    this->Internal->LinkImplementationPropertyEntries.clear();
    this->Internal->LinkImplementationPropertyBacktraces.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkImplementationPropertyEntries.emplace_back(value);
      this->Internal->LinkImplementationPropertyBacktraces.push_back(lfbt);
    }
  } else if (prop == propSOURCES) {
    this->Internal->SourceEntries.clear();
    this->Internal->SourceBacktraces.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->SourceEntries.emplace_back(value);
      this->Internal->SourceBacktraces.push_back(lfbt);
    }
  } else if (prop == propIMPORTED_GLOBAL) {
    if (!cmSystemTools::IsOn(value)) {
      std::ostringstream e;
      e << "IMPORTED_GLOBAL property can't be set to FALSE on targets (\""
        << this->Name << "\")\n";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
    /* no need to change anything if value does not change */
    if (!this->ImportedGloballyVisible) {
      this->ImportedGloballyVisible = true;
      this->GetGlobalGenerator()->IndexTarget(this);
    }
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME") &&
             !this->CheckImportedLibName(prop, value ? value : "")) {
    /* error was reported by check method */
  } else if (prop == propCUDA_PTX_COMPILATION &&
             this->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "CUDA_PTX_COMPILATION property can only be applied to OBJECT "
         "targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  } else {
    this->Properties.SetProperty(prop, value);
  }
}